

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

fdb_status
filemgr_write_dirty(filemgr *file,bid_t bid,void *buf,filemgr_dirty_update_node *node,
                   err_log_callback *log_callback)

{
  int iVar1;
  avl_node *node_00;
  void *addr;
  filemgr_dirty_update_block query;
  avl_node *local_60;
  avl_node local_58;
  bid_t local_38;
  
  local_38 = bid;
  node_00 = avl_search(&node->dirty_blocks,&local_58,_dirty_blocks_cmp);
  if (node_00 == (avl_node *)0x0) {
    node_00 = (avl_node *)calloc(1,0x30);
    local_60 = (avl_node *)0x0;
    iVar1 = posix_memalign(&local_60,0x200,(ulong)file->blocksize);
    if (iVar1 != 0) {
      local_60 = (avl_node *)0x0;
    }
    node_00[1].parent = local_60;
    node_00[1].left = (avl_node *)bid;
    avl_insert(&node->dirty_blocks,node_00,_dirty_blocks_cmp);
  }
  memcpy(node_00[1].parent,buf,(ulong)file->blocksize);
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status filemgr_write_dirty(struct filemgr *file, bid_t bid, void *buf,
                               struct filemgr_dirty_update_node *node,
                               err_log_callback *log_callback)
{
    struct avl_node *a;
    struct filemgr_dirty_update_block *block, query;

    query.bid = bid;
    a = avl_search(&node->dirty_blocks, &query.avl, _dirty_blocks_cmp);
    if (a) {
        // already exist .. overwrite
        block = _get_entry(a, struct filemgr_dirty_update_block, avl);
    } else {
        // not exist .. create a new block for this update node
        block = (struct filemgr_dirty_update_block *)
                calloc(1, sizeof(struct filemgr_dirty_update_block));
        void *addr = NULL;
        malloc_align(addr, FDB_SECTOR_SIZE, file->blocksize);
        block->addr = addr;
        block->bid = bid;
        block->immutable = false;
        avl_insert(&node->dirty_blocks, &block->avl, _dirty_blocks_cmp);
    }

    memcpy(block->addr, buf, file->blocksize);
    return FDB_RESULT_SUCCESS;
}